

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O1

ptrdiff_t CLI::detail::find_member
                    (string *name,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,bool ignore_case,bool ignore_underscore)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ptrdiff_t pVar4;
  undefined7 in_register_00000011;
  undefined1 local_d1;
  uint *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  undefined1 local_a0 [8];
  undefined8 uStack_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  long local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  uint *local_70;
  long local_68;
  uint local_60 [2];
  undefined8 uStack_58;
  uint *local_50;
  long local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  
  if ((int)CONCAT71(in_register_00000011,ignore_case) == 0) {
    if (ignore_underscore) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_b0._M_current = local_a0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
      local_d1 = 0x5f;
      _Var2 = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_b0,local_b0._M_current + local_a8,
                         (_Iter_equals_val<const_char>)&local_d1);
      local_68 = (long)_Var2._M_current - (long)local_b0._M_current;
      *_Var2._M_current = '\0';
      if (local_b0._M_current == local_a0) {
        uStack_58 = uStack_98;
        local_70 = local_60;
      }
      else {
        local_70 = (uint *)local_b0._M_current;
      }
      local_a8 = 0;
      local_a0[0] = 0;
      local_b0._M_current = local_a0;
      ::std::__cxx11::string::operator=((string *)name,(string *)&local_70);
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_b0._M_current != local_a0) {
        operator_delete(local_b0._M_current);
      }
      _Var3 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_3_>>
                        ((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,name);
    }
    else {
      _Var3 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,name);
    }
  }
  else if (ignore_underscore) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_90._M_current = (char *)&local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
    local_d1 = 0x5f;
    _Var2 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_90,local_90._M_current + local_88,
                       (_Iter_equals_val<const_char>)&local_d1);
    local_c8 = (long)_Var2._M_current - (long)local_90._M_current;
    *_Var2._M_current = '\0';
    if ((uint *)local_90._M_current == &local_80) {
      uStack_b8 = uStack_78;
      uStack_b4 = uStack_74;
      local_d0 = (uint *)&local_c0;
    }
    else {
      local_d0 = (uint *)local_90._M_current;
    }
    local_c0 = CONCAT44(uStack_7c,local_80);
    local_88 = 0;
    local_80 = local_80 & 0xffffff00;
    local_90._M_current = (char *)&local_80;
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_d0,(long)local_d0 + local_c8,local_d0);
    if (local_d0 == (uint *)&local_c0) {
      uStack_58 = CONCAT44(uStack_b4,uStack_b8);
      local_70 = local_60;
    }
    else {
      local_70 = local_d0;
    }
    local_68 = local_c8;
    local_c8 = 0;
    local_c0 = local_c0 & 0xffffffffffffff00;
    local_d0 = (uint *)&local_c0;
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_d0 != (uint *)&local_c0) {
      operator_delete(local_d0);
    }
    if ((uint *)local_90._M_current != &local_80) {
      operator_delete(local_90._M_current);
    }
    _Var3 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_1_>>
                      ((names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,name);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50 = (uint *)local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_50,(undefined1 *)((long)local_50 + local_48),local_50);
    if (local_50 == (uint *)local_40) {
      uStack_58 = uStack_38;
      local_70 = local_60;
    }
    else {
      local_70 = local_50;
    }
    local_68 = local_48;
    local_48 = 0;
    local_40[0] = 0;
    local_50 = (uint *)local_40;
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_50 != (uint *)local_40) {
      operator_delete(local_50);
    }
    _Var3 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_2_>>
                      ((names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,name);
  }
  if (_Var3._M_current ==
      (names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pVar4 = -1;
  }
  else {
    pVar4 = (long)_Var3._M_current -
            (long)(names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  return pVar4;
}

Assistant:

CLI11_INLINE std::ptrdiff_t
find_member(std::string name, const std::vector<std::string> names, bool ignore_case, bool ignore_underscore) {
    auto it = std::end(names);
    if(ignore_case) {
        if(ignore_underscore) {
            name = detail::to_lower(detail::remove_underscore(name));
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(detail::remove_underscore(local_name)) == name;
            });
        } else {
            name = detail::to_lower(name);
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(local_name) == name;
            });
        }

    } else if(ignore_underscore) {
        name = detail::remove_underscore(name);
        it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
            return detail::remove_underscore(local_name) == name;
        });
    } else {
        it = std::find(std::begin(names), std::end(names), name);
    }

    return (it != std::end(names)) ? (it - std::begin(names)) : (-1);
}